

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O0

bool __thiscall Imath_3_2::Vec3<float>::equalWithAbsError(Vec3<float> *this,Vec3<float> *v,float e)

{
  float x1;
  bool bVar1;
  float *pfVar2;
  Vec3<float> *in_RSI;
  Vec3<float> *in_RDI;
  float in_XMM0_Da;
  int i;
  int local_20;
  
  local_20 = 0;
  while( true ) {
    if (2 < local_20) {
      return true;
    }
    pfVar2 = operator[](in_RDI,local_20);
    x1 = *pfVar2;
    pfVar2 = operator[](in_RSI,local_20);
    bVar1 = equalWithAbsError<float>(x1,*pfVar2,in_XMM0_Da);
    if (!bVar1) break;
    local_20 = local_20 + 1;
  }
  return false;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Vec3<T>::equalWithAbsError (const Vec3<T>& v, T e) const IMATH_NOEXCEPT
{
    for (int i = 0; i < 3; i++)
        if (!IMATH_INTERNAL_NAMESPACE::equalWithAbsError ((*this)[i], v[i], e))
            return false;

    return true;
}